

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintString
          (FastFieldValuePrinter *this,string *val,BaseTextGenerator *generator)

{
  BaseTextGenerator *this_00;
  ulong uVar1;
  char *in_RCX;
  undefined1 auVar2 [16];
  string_view src;
  string local_50;
  string_view local_30;
  BaseTextGenerator *local_20;
  BaseTextGenerator *generator_local;
  string *val_local;
  FastFieldValuePrinter *this_local;
  
  local_20 = generator;
  generator_local = (BaseTextGenerator *)val;
  val_local = (string *)this;
  BaseTextGenerator::PrintLiteral<2ul>(generator,(char (*) [2])0x7aa5cc);
  uVar1 = std::__cxx11::string::empty();
  this_00 = local_20;
  if ((uVar1 & 1) == 0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)generator_local);
    src._M_len = auVar2._8_8_;
    src._M_str = in_RCX;
    absl::lts_20250127::CEscape_abi_cxx11_(&local_50,auVar2._0_8_,src);
    local_30 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
    BaseTextGenerator::PrintString(this_00,local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  BaseTextGenerator::PrintLiteral<2ul>(local_20,(char (*) [2])0x7aa5cc);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintString(
    const std::string& val, BaseTextGenerator* generator) const {
  generator->PrintLiteral("\"");
  if (!val.empty()) {
    generator->PrintString(absl::CEscape(val));
  }
  generator->PrintLiteral("\"");
}